

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_text::as_bool(xml_text *this,bool def)

{
  xml_node_struct *pxVar1;
  byte local_21;
  xml_node_struct *d;
  bool def_local;
  xml_text *this_local;
  
  pxVar1 = _data(this);
  local_21 = def;
  if ((pxVar1 != (xml_node_struct *)0x0) && (pxVar1->value != (char_t *)0x0)) {
    local_21 = impl::anon_unknown_0::get_value_bool(pxVar1->value);
  }
  return (bool)(local_21 & 1);
}

Assistant:

PUGI__FN bool xml_text::as_bool(bool def) const
	{
		xml_node_struct* d = _data();

		return (d && d->value) ? impl::get_value_bool(d->value) : def;
	}